

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

int __thiscall re2::Prog::ComputeFirstByte(Prog *this)

{
  byte bVar1;
  Deleter DVar2;
  uint uVar3;
  Inst *pIVar4;
  uint uVar5;
  ostream *poVar6;
  _Head_base<0UL,_int_*,_false> _Var7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  _Head_base<0UL,_int_*,_false> _Var12;
  SparseSet q;
  SparseSetT<void> local_1d8;
  LogMessage local_1b0;
  
  SparseSetT<void>::SparseSetT(&local_1d8,this->size_);
  if (((uint *)local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
               _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl == (uint *)0x0) ||
     (DVar2.len_ = this->start_,
     (uint)local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
           super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_ <=
     (uint)DVar2.len_)) {
LAB_001ce186:
    if (local_1d8.size_ == 0) {
switchD_001ce1bc_caseD_5:
      uVar11 = 0xffffffff;
      goto LAB_001ce373;
    }
  }
  else if (((uint)local_1d8.size_ <=
            (uint)local_1d8.sparse_.ptr_._M_t.
                  super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl[DVar2.len_]) ||
          (local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl
           [local_1d8.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
            .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[DVar2.len_]] != DVar2.len_)) {
    local_1d8.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[DVar2.len_] = local_1d8.size_;
    local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[local_1d8.size_] = DVar2.len_;
    local_1d8.size_ = local_1d8.size_ + 1;
    goto LAB_001ce186;
  }
  puVar9 = (uint *)(local_1d8.dense_.ptr_._M_t.
                    super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl + local_1d8.size_);
  uVar11 = 0xffffffff;
  _Var7._M_head_impl =
       local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  _Var12._M_head_impl =
       local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  uVar8 = local_1d8.size_;
  do {
    uVar3 = *_Var12._M_head_impl;
    pIVar4 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar10 = pIVar4[(int)uVar3].out_opcode_;
    uVar5 = uVar11;
    switch(uVar10 & 7) {
    case 0:
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                 ,0x272);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"unhandled ",10)
      ;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_1b0.str_,pIVar4[(int)uVar3].out_opcode_ & 7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," in ComputeFirstByte",0x14);
      LogMessage::~LogMessage(&local_1b0);
      _Var7._M_head_impl =
           local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      uVar8 = local_1d8.size_;
      break;
    case 1:
      if ((((uint *)_Var7._M_head_impl != (uint *)0x0) &&
          (uVar11 = uVar3 + 1,
          uVar11 < (uint)local_1d8.dense_.ptr_._M_t.
                         super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                         super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                         super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_
          )) && ((uVar8 <= (uint)local_1d8.sparse_.ptr_._M_t.
                                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl
                                 [(long)(int)uVar3 + 1] ||
                 (((uint *)_Var7._M_head_impl)
                  [local_1d8.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)(int)uVar3 + 1]] != uVar11
                 )))) {
        local_1d8.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)(int)uVar3 + 1] = uVar8;
        *puVar9 = uVar11;
LAB_001ce277:
        local_1d8.size_ = local_1d8.size_ + 1;
        uVar8 = local_1d8.size_;
      }
      break;
    case 2:
      if (((((uVar10 & 8) == 0) && ((uint *)_Var7._M_head_impl != (uint *)0x0)) &&
          (uVar10 = uVar3 + 1,
          uVar10 < (uint)local_1d8.dense_.ptr_._M_t.
                         super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                         super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                         super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_
          )) && ((uVar8 <= (uint)local_1d8.sparse_.ptr_._M_t.
                                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl
                                 [(long)(int)uVar3 + 1] ||
                 (((uint *)_Var7._M_head_impl)
                  [local_1d8.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)(int)uVar3 + 1]] != uVar10
                 )))) {
        local_1d8.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)(int)uVar3 + 1] = uVar8;
        *puVar9 = uVar10;
        uVar8 = local_1d8.size_ + 1;
        local_1d8.size_ = uVar8;
      }
      bVar1 = pIVar4[(int)uVar3].field_1.field_3.lo_;
      if (((bVar1 != pIVar4[(int)uVar3].field_1.field_3.hi_) ||
          (((byte)(bVar1 + 0x9f) < 0x1a &&
           ((pIVar4[(int)uVar3].field_1.field_3.hint_foldcase_ & 1) != 0)))) ||
         ((uVar5 = (uint)bVar1, uVar11 != 0xffffffff && (uVar5 = uVar11, uVar11 != bVar1))))
      goto switchD_001ce1bc_caseD_5;
      break;
    default:
      if ((((uVar10 & 8) == 0) && ((uint *)_Var7._M_head_impl != (uint *)0x0)) &&
         (uVar11 = uVar3 + 1,
         uVar11 < (uint)local_1d8.dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                        super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                        super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_)
         ) {
        if ((uVar8 <= (uint)local_1d8.sparse_.ptr_._M_t.
                            super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar11]) ||
           (((uint *)_Var7._M_head_impl)
            [local_1d8.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
             _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar11]] != uVar11)) {
          local_1d8.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar11] = uVar8;
          *puVar9 = uVar11;
          uVar8 = local_1d8.size_ + 1;
          uVar10 = pIVar4[(int)uVar3].out_opcode_;
          local_1d8.size_ = uVar8;
        }
      }
      if (((0xf < uVar10) && ((uint *)_Var7._M_head_impl != (uint *)0x0)) &&
         (uVar10 = uVar10 >> 4,
         uVar10 < (uint)local_1d8.dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                        super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                        super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_)
         ) {
        if ((uVar8 <= (uint)local_1d8.sparse_.ptr_._M_t.
                            super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar10]) ||
           (((uint *)_Var7._M_head_impl)
            [local_1d8.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
             _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar10]] != uVar10)) {
          local_1d8.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar10] = uVar8;
          ((uint *)_Var7._M_head_impl)[(int)uVar8] = uVar10;
          goto LAB_001ce277;
        }
      }
      break;
    case 5:
      goto switchD_001ce1bc_caseD_5;
    case 7:
      break;
    }
    uVar11 = uVar5;
    _Var12._M_head_impl = _Var12._M_head_impl + 1;
    puVar9 = (uint *)_Var7._M_head_impl + (int)uVar8;
  } while ((uint *)_Var12._M_head_impl != puVar9);
LAB_001ce373:
  SparseSetT<void>::~SparseSetT(&local_1d8);
  return uVar11;
}

Assistant:

int Prog::ComputeFirstByte() {
  int b = -1;
  SparseSet q(size());
  q.insert(start());
  for (SparseSet::iterator it = q.begin(); it != q.end(); ++it) {
    int id = *it;
    Prog::Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled " << ip->opcode() << " in ComputeFirstByte";
        break;

      case kInstMatch:
        // The empty string matches: no first byte.
        return -1;

      case kInstByteRange:
        if (!ip->last())
          q.insert(id+1);

        // Must match only a single byte
        if (ip->lo() != ip->hi())
          return -1;
        if (ip->foldcase() && 'a' <= ip->lo() && ip->lo() <= 'z')
          return -1;
        // If we haven't seen any bytes yet, record it;
        // otherwise must match the one we saw before.
        if (b == -1)
          b = ip->lo();
        else if (b != ip->lo())
          return -1;
        break;

      case kInstNop:
      case kInstCapture:
      case kInstEmptyWidth:
        if (!ip->last())
          q.insert(id+1);

        // Continue on.
        // Ignore ip->empty() flags for kInstEmptyWidth
        // in order to be as conservative as possible
        // (assume all possible empty-width flags are true).
        if (ip->out())
          q.insert(ip->out());
        break;

      case kInstAltMatch:
        DCHECK(!ip->last());
        q.insert(id+1);
        break;

      case kInstFail:
        break;
    }
  }
  return b;
}